

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O3

int arkStep_NlsFPFunction_MassTDep(N_Vector zcor,N_Vector g,void *arkode_mem)

{
  int iVar1;
  int iVar2;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_28;
  ARKodeMem local_20;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"arkStep_NlsFPFunction_MassTDep",&local_20,&local_28);
  if (iVar1 == 0) {
    N_VLinearSum(1.0,local_28->zpred,1.0,zcor,local_20->ycur);
    iVar2 = (*local_28->nls_fi)(local_20->tcur,local_20->ycur,local_28->Fi[local_28->istage],
                                local_20->user_data);
    local_28->nfi = local_28->nfi + 1;
    iVar1 = -8;
    if (-1 < iVar2) {
      if (iVar2 == 0) {
        N_VScale(local_28->gamma,local_28->Fi[local_28->istage],g);
        iVar2 = (*local_28->msolve)(local_20,g,local_28->nlscoef);
        if ((-1 < iVar2) && (iVar1 = 9, iVar2 == 0)) {
          N_VLinearSum(1.0,g,1.0,local_28->sdata,g);
          iVar1 = 0;
        }
      }
      else {
        iVar1 = 9;
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_NlsFPFunction_MassTDep(N_Vector zcor, N_Vector g, void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "arkStep_NlsFPFunction_MassTDep",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS and save for later */
  retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                            step_mem->Fi[step_mem->istage],
                            ark_mem->user_data);
  step_mem->nfi++;
  if (retval < 0) return(ARK_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  /* copy step_mem->gamma*Fi into g */
  N_VScale(step_mem->gamma, step_mem->Fi[step_mem->istage], g);

  /* perform mass matrix solve */
  retval = step_mem->msolve((void *) ark_mem, g, step_mem->nlscoef);
  if (retval < 0) return(ARK_RHSFUNC_FAIL);
  if (retval > 0) return(RHSFUNC_RECVR);

  /* combine parts:  g = g + sdata */
  N_VLinearSum(ONE, g, ONE, step_mem->sdata, g);

  return(ARK_SUCCESS);
}